

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_len.c
# Opt level: O0

uint str_len(char *s)

{
  int iVar1;
  char *local_20;
  char *t;
  char *s_local;
  
  local_20 = s;
  while( true ) {
    iVar1 = (int)s;
    if (*local_20 == '\0') {
      return (int)local_20 - iVar1;
    }
    if (local_20[1] == '\0') {
      return (int)(local_20 + 1) - iVar1;
    }
    if (local_20[2] == '\0') {
      return (int)(local_20 + 2) - iVar1;
    }
    if (local_20[3] == '\0') break;
    local_20 = local_20 + 4;
  }
  return (int)(local_20 + 3) - iVar1;
}

Assistant:

unsigned int str_len(const char *s)
{
  register const char *t;

  t = s;
  for (;;) {
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
  }
}